

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O1

bool deqp::egl::Image::isCompatibleFormats
               (GLenum createFormat,GLenum modifyFormat,GLenum modifyType)

{
  bool bVar1;
  bool bVar2;
  
  if (modifyFormat == 0x1908) {
    if ((int)modifyType < 0x8033) {
      if (modifyType == 0x1401) {
        if (createFormat - 0x8056 < 3) {
          return true;
        }
        if (createFormat == 0x1908) {
          return true;
        }
        if (createFormat == 0x8c43) {
          return true;
        }
        return false;
      }
      if (modifyType != 0x1406) {
        if (modifyType != 0x140b) {
          return false;
        }
        return createFormat == 0x881a;
      }
      bVar1 = createFormat == 0x881a;
      bVar2 = createFormat == 0x8814;
    }
    else {
      if (modifyType == 0x8033) {
        bVar1 = createFormat == 0x8056;
      }
      else {
        if (modifyType != 0x8034) {
          if (modifyType != 0x8368) {
            return false;
          }
          return (createFormat - 0x8057 & 0xfffffffd) == 0;
        }
        bVar1 = createFormat == 0x8057;
      }
      bVar2 = createFormat == 0x1908;
    }
LAB_00e8a34a:
    bVar2 = (bool)(bVar2 | bVar1);
  }
  else {
    if (modifyFormat != 0x1907) {
      return false;
    }
    if ((int)modifyType < 0x140b) {
      if (modifyType == 0x1400) {
        return createFormat == 0x8f96;
      }
      if (modifyType == 0x1401) {
        if (0x8c40 < (int)createFormat) {
          if (createFormat == 0x8c41) {
            return true;
          }
          if (createFormat == 0x8d62) {
            return true;
          }
          return false;
        }
        if (createFormat == 0x1907) {
          return true;
        }
        if (createFormat != 0x8051) {
          return false;
        }
        return true;
      }
      if (modifyType != 0x1406) {
        return false;
      }
      if ((int)createFormat < 0x8c3a) {
        if (createFormat == 0x8815) {
          return true;
        }
        if (createFormat == 0x881b) {
          return true;
        }
        return false;
      }
    }
    else {
      if (0x8c3a < (int)modifyType) {
        if (modifyType == 0x8c3b) {
          bVar1 = createFormat == 0x8c3a;
        }
        else {
          if (modifyType != 0x8c3e) {
            return false;
          }
          bVar1 = createFormat == 0x8c3d;
        }
        return bVar1;
      }
      if (modifyType != 0x140b) {
        if (modifyType != 0x8363) {
          return false;
        }
        bVar1 = createFormat == 0x1907;
        bVar2 = createFormat == 0x8d62;
        goto LAB_00e8a34a;
      }
      if (createFormat == 0x881b) {
        return true;
      }
    }
    bVar2 = true;
    if ((createFormat != 0x8c3a) && (createFormat != 0x8c3d)) {
      return false;
    }
  }
  return bVar2;
}

Assistant:

bool isCompatibleFormats (GLenum createFormat, GLenum modifyFormat, GLenum modifyType)
{
	switch (modifyFormat)
	{
		case GL_RGB:
			switch (modifyType)
			{
				case GL_UNSIGNED_BYTE:
					return createFormat == GL_RGB
							|| createFormat == GL_RGB8
							|| createFormat == GL_RGB565
							|| createFormat == GL_SRGB8;

				case GL_BYTE:
					return createFormat == GL_RGB8_SNORM;

				case GL_UNSIGNED_SHORT_5_6_5:
					return createFormat == GL_RGB
							|| createFormat == GL_RGB565;

				case GL_UNSIGNED_INT_10F_11F_11F_REV:
					return createFormat == GL_R11F_G11F_B10F;

				case GL_UNSIGNED_INT_5_9_9_9_REV:
					return createFormat == GL_RGB9_E5;

				case GL_HALF_FLOAT:
					return createFormat == GL_RGB16F
							|| createFormat == GL_R11F_G11F_B10F
							|| createFormat == GL_RGB9_E5;

				case GL_FLOAT:
					return createFormat == GL_RGB16F
							|| createFormat == GL_RGB32F
							|| createFormat == GL_R11F_G11F_B10F
							|| createFormat == GL_RGB9_E5;

				default:
					DE_FATAL("Unknown modify type");
					return false;
			}

		case GL_RGBA:
			switch (modifyType)
			{
				case GL_UNSIGNED_BYTE:
					return createFormat == GL_RGBA8
						|| createFormat == GL_RGB5_A1
						|| createFormat == GL_RGBA4
						|| createFormat == GL_SRGB8_ALPHA8
						|| createFormat == GL_RGBA;

				case GL_UNSIGNED_SHORT_4_4_4_4:
					return createFormat == GL_RGBA4
						|| createFormat == GL_RGBA;

				case GL_UNSIGNED_SHORT_5_5_5_1:
					return createFormat == GL_RGB5_A1
						|| createFormat == GL_RGBA;

				case GL_UNSIGNED_INT_2_10_10_10_REV:
					return createFormat == GL_RGB10_A2
						|| createFormat == GL_RGB5_A1;

				case GL_HALF_FLOAT:
					return createFormat == GL_RGBA16F;

				case GL_FLOAT:
					return createFormat == GL_RGBA16F
						|| createFormat == GL_RGBA32F;

				default:
					DE_FATAL("Unknown modify type");
					return false;
			};

		default:
			DE_FATAL("Unknown modify format");
			return false;
	}
}